

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_3_4::CompositeDeepScanLine::setFrameBuffer(CompositeDeepScanLine *this,FrameBuffer *fr)

{
  bool bVar1;
  reference pvVar2;
  Slice *pSVar3;
  ostream *poVar4;
  ArgExc *this_00;
  value_type *__x;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string name;
  stringstream _iex_throw_s;
  ConstIterator q;
  FrameBuffer *in_stack_fffffffffffffdb8;
  undefined5 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc5;
  undefined1 in_stack_fffffffffffffdc6;
  undefined1 in_stack_fffffffffffffdc7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_type in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde0;
  allocator<char> *in_stack_fffffffffffffdf0;
  undefined1 local_1d9 [49];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  const_iterator local_20;
  const_iterator local_18;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RDI->_M_string_length + 0xb0),0);
  std::__cxx11::string::operator=((string *)pvVar2,"Z");
  pcVar5 = "Z";
  if ((*(byte *)(in_RDI->_M_string_length + 0x60) & 1) != 0) {
    pcVar5 = "ZBack";
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RDI->_M_string_length + 0xb0),1);
  std::__cxx11::string::operator=((string *)pvVar2,pcVar5);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RDI->_M_string_length + 0xb0),2);
  std::__cxx11::string::operator=((string *)pvVar2,"A");
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_18._M_node = (_Base_ptr)FrameBuffer::begin(in_stack_fffffffffffffdb8);
  while( true ) {
    local_20._M_node = (_Base_ptr)FrameBuffer::end(in_stack_fffffffffffffdb8);
    bVar1 = Imf_3_4::operator!=((ConstIterator *)
                                CONCAT17(in_stack_fffffffffffffdc7,
                                         CONCAT16(in_stack_fffffffffffffdc6,
                                                  CONCAT15(in_stack_fffffffffffffdc5,
                                                           in_stack_fffffffffffffdc0))),
                                (ConstIterator *)in_stack_fffffffffffffdb8);
    if (!bVar1) {
      FrameBuffer::operator=
                ((FrameBuffer *)
                 CONCAT17(in_stack_fffffffffffffdc7,
                          CONCAT16(in_stack_fffffffffffffdc6,
                                   CONCAT15(in_stack_fffffffffffffdc5,in_stack_fffffffffffffdc0))),
                 in_stack_fffffffffffffdb8);
      return;
    }
    pSVar3 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x17f942);
    if ((pSVar3->xSampling != 1) ||
       (pSVar3 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x17f955),
       pSVar3->ySampling != 1)) break;
    __x = (value_type *)FrameBuffer::ConstIterator::name((ConstIterator *)0x17fa5f);
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,pcVar5,in_stack_fffffffffffffdf0);
    std::allocator<char>::~allocator((allocator<char> *)local_1d9);
    in_stack_fffffffffffffdc7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdc7,
                                  CONCAT16(in_stack_fffffffffffffdc6,
                                           CONCAT15(in_stack_fffffffffffffdc5,
                                                    in_stack_fffffffffffffdc0))),
                         (char *)in_stack_fffffffffffffdb8);
    if ((bool)in_stack_fffffffffffffdc7) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffdc7,
                          CONCAT16(in_stack_fffffffffffffdc6,
                                   CONCAT15(in_stack_fffffffffffffdc5,in_stack_fffffffffffffdc0))),
                 (value_type_conflict3 *)in_stack_fffffffffffffdb8);
    }
    else {
      in_stack_fffffffffffffdc6 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffdc7,
                                    CONCAT16(in_stack_fffffffffffffdc6,
                                             CONCAT15(in_stack_fffffffffffffdc5,
                                                      in_stack_fffffffffffffdc0))),
                           (char *)in_stack_fffffffffffffdb8);
      if ((bool)in_stack_fffffffffffffdc6) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffdc7,
                            CONCAT16(in_stack_fffffffffffffdc6,
                                     CONCAT15(in_stack_fffffffffffffdc5,in_stack_fffffffffffffdc0)))
                   ,(value_type_conflict3 *)in_stack_fffffffffffffdb8);
      }
      else {
        in_stack_fffffffffffffdc5 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffdc7,
                                      CONCAT16(in_stack_fffffffffffffdc6,
                                               CONCAT15(in_stack_fffffffffffffdc5,
                                                        in_stack_fffffffffffffdc0))),
                             (char *)in_stack_fffffffffffffdb8);
        if ((bool)in_stack_fffffffffffffdc5) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffffdc7,
                              CONCAT16(in_stack_fffffffffffffdc6,
                                       CONCAT15(in_stack_fffffffffffffdc5,in_stack_fffffffffffffdc0)
                                      )),(value_type_conflict3 *)in_stack_fffffffffffffdb8);
        }
        else {
          in_stack_fffffffffffffdb8 = (FrameBuffer *)(in_RDI->_M_string_length + 200);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI->_M_string_length + 0xb0));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffffdc7,
                              CONCAT16(in_stack_fffffffffffffdc6,
                                       CONCAT15(in_stack_fffffffffffffdc5,in_stack_fffffffffffffdc0)
                                      )),(value_type_conflict3 *)in_stack_fffffffffffffdb8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_01,__x);
        }
      }
    }
    std::__cxx11::string::~string((string *)(local_1d9 + 1));
    FrameBuffer::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffdb8,0);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar4 = std::operator<<(local_198,"X and/or y subsampling factors of \"");
  pcVar5 = FrameBuffer::ConstIterator::name((ConstIterator *)0x17f99b);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\" channel in framebuffer are not 1");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_1a8);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::setFrameBuffer (const FrameBuffer& fr)
{

    //
    // count channels; build map between channels in frame buffer
    // and channels in internal buffers
    //

    _Data->_channels.resize (3);
    _Data->_channels[0] = "Z";
    _Data->_channels[1] = _Data->_zback ? "ZBack" : "Z";
    _Data->_channels[2] = "A";
    _Data->_bufferMap.resize (0);

    for (FrameBuffer::ConstIterator q = fr.begin (); q != fr.end (); q++)
    {

        //
        // Frame buffer must have xSampling and ySampling set to 1
        // (Sampling in FrameBuffers must match sampling in file,
        //  and Header::sanityCheck enforces sampling in deep files is 1)
        //

        if (q.slice ().xSampling != 1 || q.slice ().ySampling != 1)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << q.name ()
                    << "\" channel in framebuffer "
                       "are not 1");
        }

        string name (q.name ());
        if (name == "ZBack") { _Data->_bufferMap.push_back (1); }
        else if (name == "Z") { _Data->_bufferMap.push_back (0); }
        else if (name == "A") { _Data->_bufferMap.push_back (2); }
        else
        {
            _Data->_bufferMap.push_back (
                static_cast<int> (_Data->_channels.size ()));
            _Data->_channels.push_back (name);
        }
    }

    _Data->_outputFrameBuffer = fr;
}